

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

void do_cmd_birth_init(command_conflict *cmd)

{
  player *p;
  wchar_t wVar1;
  char *roman;
  player_race *r;
  player_class *c;
  wchar_t success;
  char *buf;
  command_conflict *cmd_local;
  
  p = player;
  character_dungeon = false;
  if (player->ht_birth == 0) {
    r = player_id2race(0);
    c = player_id2class(0);
    player_generate(p,r,c,false);
    quickstart_allowed = false;
  }
  else {
    roman = find_roman_suffix_start(player->full_name);
    if (roman != (char *)0x0) {
      wVar1 = roman_to_int(roman);
      wVar1 = int_to_roman(wVar1 + L'\x01',roman,0x20 - ((long)roman - (long)player->full_name));
      if (wVar1 == L'\0') {
        msg("Sorry, could not deal with suffix");
      }
    }
    save_roller_data(&quickstart_prev);
    quickstart_allowed = true;
  }
  event_signal_flag(EVENT_ENTER_BIRTH,quickstart_allowed);
  return;
}

Assistant:

void do_cmd_birth_init(struct command *cmd)
{
	char *buf;

	/* The dungeon is not ready */
	character_dungeon = false;

	/*
	 * If there's a quickstart character, store it for later use.
	 * If not, default to whatever the first of the choices is.
	 */
	if (player->ht_birth) {
		/* Handle incrementing name suffix */
		buf = find_roman_suffix_start(player->full_name);
		if (buf) {
			/* Try to increment the roman suffix */
			int success = int_to_roman(
				roman_to_int(buf) + 1,
				buf,
				sizeof(player->full_name) - (buf - (char *)&player->full_name));

			if (!success) {
				msg("Sorry, could not deal with suffix");
			}
		}

		save_roller_data(&quickstart_prev);
		quickstart_allowed = true;
	} else {
		player_generate(player, player_id2race(0), player_id2class(0), false);
		quickstart_allowed = false;
	}

	/* We're ready to start the birth process */
	event_signal_flag(EVENT_ENTER_BIRTH, quickstart_allowed);
}